

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O3

void basisu::gaussian_filter
               (imagef *dst,imagef *orig_img,uint32_t odd_filter_width,float sigma_sqr,bool wrapping
               ,uint32_t width_divisor,uint32_t height_divisor)

{
  ulong uVar1;
  float fVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint h;
  uint uVar5;
  uint uVar6;
  vec<4U,_float> *pvVar7;
  int iVar8;
  char *__function;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint w;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  vector2D<float> kernel;
  ulong local_f0;
  vector2D<float> local_a0;
  ulong local_88;
  ulong local_80;
  imagef *local_78;
  ulong local_70;
  ulong local_68;
  float *local_60;
  ulong local_58;
  ulong local_50;
  vec4F local_48;
  
  if ((odd_filter_width & 1) == 0) {
    __assert_fail("odd_filter_width && (odd_filter_width & 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_ssim.cpp"
                  ,0x5e,
                  "void basisu::gaussian_filter(imagef &, const imagef &, uint32_t, float, bool, uint32_t, uint32_t)"
                 );
  }
  vector2D<float>::vector2D(&local_a0,odd_filter_width,odd_filter_width);
  if (local_a0.m_values.m_size == 0) {
LAB_0024ee1e:
    __function = "T &basisu::vector<float>::operator[](size_t) [T = float]";
LAB_0024ee33:
    __assert_fail("i < m_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x178,__function);
  }
  compute_gaussian_kernel(local_a0.m_values.m_p,odd_filter_width,odd_filter_width,sigma_sqr,1);
  w = orig_img->m_width / width_divisor;
  h = orig_img->m_height / height_divisor;
  local_48.m_v[0] = 0.0;
  local_48.m_v[1] = 0.0;
  local_48.m_v[2] = 0.0;
  local_48.m_v[3] = 1.0;
  imagef::crop(dst,w,h,0xffffffff,&local_48);
  if (0 < (int)h) {
    uVar9 = odd_filter_width >> 1;
    local_70 = (ulong)uVar9;
    local_80 = (ulong)width_divisor;
    local_50 = (ulong)odd_filter_width | 1;
    local_88 = (ulong)((width_divisor >> 1) - uVar9);
    uVar14 = 0;
    do {
      local_78 = dst;
      if (0 < (int)w) {
        uVar5 = uVar14 * height_divisor + (height_divisor >> 1);
        local_68 = (ulong)uVar5;
        uVar16 = 0;
        local_f0 = local_88;
        do {
          uVar3 = orig_img->m_width;
          uVar4 = orig_img->m_height;
          local_60 = local_a0.m_values.m_p;
          fVar20 = 0.0;
          fVar21 = 0.0;
          fVar22 = 0.0;
          fVar23 = 0.0;
          uVar15 = 0;
          uVar6 = -uVar9;
          do {
            local_58 = (ulong)uVar6;
            iVar8 = uVar5 + uVar6;
            iVar17 = uVar4 - 1;
            if (iVar8 < (int)(uVar4 - 1)) {
              iVar17 = iVar8;
            }
            if (iVar8 < 0) {
              iVar17 = 0;
            }
            lVar18 = 0;
            do {
              uVar1 = local_f0 + lVar18;
              iVar10 = (int)uVar1;
              if (wrapping) {
                if (iVar10 < 0) {
                  iVar10 = (int)((long)((ulong)(uint)(iVar10 >> 0x1f) << 0x20 | uVar1 & 0xffffffff)
                                % (long)(int)uVar3);
                  iVar13 = uVar3 + iVar10;
                  if (iVar10 == 0) {
                    iVar13 = 0;
                  }
                }
                else {
                  iVar13 = iVar10;
                  if ((int)uVar3 <= iVar10) {
                    iVar13 = (int)((long)((ulong)(uint)(iVar10 >> 0x1f) << 0x20 | uVar1 & 0xffffffff
                                         ) % (long)(int)uVar3);
                  }
                }
                if (iVar8 < 0) {
                  iVar11 = iVar8 % (int)uVar4 + uVar4;
                  if (iVar8 % (int)uVar4 == 0) {
                    iVar11 = 0;
                  }
                }
                else {
                  iVar11 = iVar8;
                  if ((int)uVar4 <= iVar8) {
                    iVar11 = iVar8 % (int)uVar4;
                  }
                }
              }
              else {
                iVar13 = uVar3 - 1;
                if (iVar10 < (int)(uVar3 - 1)) {
                  iVar13 = iVar10;
                }
                iVar11 = iVar17;
                if (iVar10 < 0) {
                  iVar13 = 0;
                }
              }
              uVar12 = iVar11 * orig_img->m_pitch + iVar13;
              if ((orig_img->m_pixels).m_size <= uVar12) {
                __assert_fail("i < m_size",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                              ,0x177,
                              "const T &basisu::vector<basisu::vec<4, float>>::operator[](size_t) const [T = basisu::vec<4, float>]"
                             );
              }
              if ((local_a0.m_width <= (uint)lVar18) || (local_a0.m_height <= uVar6 + uVar9)) {
                __assert_fail("x < m_width && y < m_height",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                              ,0xd2a,
                              "T &basisu::vector2D<float>::operator()(uint32_t, uint32_t) [T = float]"
                             );
              }
              if (local_a0.m_values.m_size <= uVar15 + (uint)lVar18) goto LAB_0024ee1e;
              pvVar7 = (orig_img->m_pixels).m_p + uVar12;
              fVar2 = local_a0.m_values.m_p[(ulong)uVar15 + lVar18];
              fVar20 = fVar20 + fVar2 * pvVar7->m_v[0];
              fVar21 = fVar21 + fVar2 * pvVar7->m_v[1];
              fVar22 = fVar22 + fVar2 * pvVar7->m_v[2];
              fVar23 = fVar23 + fVar2 * pvVar7->m_v[3];
              lVar18 = lVar18 + 1;
            } while ((int)local_50 != (int)lVar18);
            uVar15 = uVar15 + local_a0.m_width;
            bVar19 = uVar6 != uVar9;
            uVar6 = uVar6 + 1;
          } while (bVar19);
          if ((dst->m_width <= uVar16) || (dst->m_height <= uVar14)) {
            __assert_fail("x < m_width && y < m_height",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                          ,0xc3e,"vec4F &basisu::imagef::operator()(uint32_t, uint32_t)");
          }
          uVar6 = dst->m_pitch * uVar14 + uVar16;
          if ((dst->m_pixels).m_size <= uVar6) {
            __function = 
            "T &basisu::vector<basisu::vec<4, float>>::operator[](size_t) [T = basisu::vec<4, float>]"
            ;
            goto LAB_0024ee33;
          }
          pvVar7 = (dst->m_pixels).m_p + uVar6;
          pvVar7->m_v[0] = fVar20;
          pvVar7->m_v[1] = fVar21;
          pvVar7->m_v[2] = fVar22;
          pvVar7->m_v[3] = fVar23;
          uVar16 = uVar16 + 1;
          local_f0 = local_f0 + local_80;
        } while ((int)uVar16 < (int)w);
      }
      uVar14 = uVar14 + 1;
    } while ((int)uVar14 < (int)h);
  }
  if (local_a0.m_values.m_p != (float *)0x0) {
    free(local_a0.m_values.m_p);
  }
  return;
}

Assistant:

void gaussian_filter(imagef &dst, const imagef &orig_img, uint32_t odd_filter_width, float sigma_sqr, bool wrapping, uint32_t width_divisor, uint32_t height_divisor)
	{
		assert(odd_filter_width && (odd_filter_width & 1));
		odd_filter_width |= 1;

		vector2D<float> kernel(odd_filter_width, odd_filter_width);
		compute_gaussian_kernel(kernel.get_ptr(), odd_filter_width, odd_filter_width, sigma_sqr, cComputeGaussianFlagNormalize);

		const int dst_width = orig_img.get_width() / width_divisor;
		const int dst_height = orig_img.get_height() / height_divisor;

		const int H = odd_filter_width / 2;
		const int L = -H;

		dst.crop(dst_width, dst_height);

//#pragma omp parallel for
		for (int oy = 0; oy < dst_height; oy++)
		{
			for (int ox = 0; ox < dst_width; ox++)
			{
				vec4F c(0.0f);

				for (int yd = L; yd <= H; yd++)
				{
					int y = oy * height_divisor + (height_divisor >> 1) + yd;

					for (int xd = L; xd <= H; xd++)
					{
						int x = ox * width_divisor + (width_divisor >> 1) + xd;

						const vec4F &p = orig_img.get_clamped_or_wrapped(x, y, wrapping, wrapping);

						float w = kernel(xd + H, yd + H);
						c[0] += p[0] * w;
						c[1] += p[1] * w;
						c[2] += p[2] * w;
						c[3] += p[3] * w;
					}
				}

				dst(ox, oy).set(c[0], c[1], c[2], c[3]);
			}
		}
	}